

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O1

void __thiscall
QPDFAcroFormDocumentHelper::adjustAppearanceStream
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *stream,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          *dr_map)

{
  string *key;
  iterator *this_00;
  QPDFObjectHandle *oh;
  size_type sVar1;
  undefined8 uVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  reference pTVar6;
  ResourceReplacer *this_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  *rnames;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  QPDFObjectHandle resources;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *__range1;
  QPDFObjectHandle merge_with;
  QPDFObjectHandle existing_old;
  QPDFObjectHandle dict;
  ResourceFinder rf;
  QPDFObjectHandle existing_new;
  string local_228;
  undefined1 local_208 [24];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [40];
  shared_ptr<QPDFObjectHandle::TokenFilter> local_1b8;
  QPDFDictItems local_1a8;
  QPDFObjectHandle local_198;
  QPDFObjectHandle local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148 [8];
  _Base_ptr local_c0;
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  iterator local_a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_228.field_2._M_allocated_capacity = (size_type)stream;
  local_228.field_2._8_8_ = dr_map;
  local_208._16_8_ = this;
  QPDFObjectHandle::getDict((QPDFObjectHandle *)local_168);
  local_158._M_allocated_capacity = (size_type)local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_168 + 0x10),"/Resources","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_228,(string *)local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_allocated_capacity != local_148) {
    operator_delete((void *)local_158._M_allocated_capacity,local_148[0]._M_allocated_capacity + 1);
  }
  bVar3 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)&local_228);
  QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)(local_168 + 0x10));
  uVar2 = local_158._8_8_;
  local_228._M_dataplus._M_p = (pointer)local_158._M_allocated_capacity;
  sVar1 = local_228._M_string_length;
  local_158._M_allocated_capacity = 0;
  local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_228._M_string_length = uVar2;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
  }
  if (bVar3) {
    oh = *(QPDFObjectHandle **)(local_208._16_8_ + 8);
    local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p;
    local_170 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._M_string_length;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_228._M_string_length + 8) =
             *(_Atomic_word *)(local_228._M_string_length + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_228._M_string_length + 8) =
             *(_Atomic_word *)(local_228._M_string_length + 8) + 1;
      }
    }
    QPDF::makeIndirectObject((QPDF *)(local_168 + 0x10),oh);
    uVar2 = local_158._8_8_;
    local_228._M_dataplus._M_p = (pointer)local_158._M_allocated_capacity;
    sVar1 = local_228._M_string_length;
    local_158._M_allocated_capacity = 0;
    local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228._M_string_length = uVar2;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
    }
    if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170);
    }
  }
  local_158._M_allocated_capacity = (size_type)local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_168 + 0x10),"/Resources","");
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)local_168,(string *)(local_168 + 0x10),
             (QPDFObjectHandle *)&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_allocated_capacity != local_148) {
    operator_delete((void *)local_158._M_allocated_capacity,local_148[0]._M_allocated_capacity + 1);
  }
  QPDFObjectHandle::newDictionary();
  p_Var4 = *(_Base_ptr *)(local_228.field_2._8_8_ + 0x18);
  p_Var5 = (_Base_ptr)(local_228.field_2._8_8_ + 8);
  if (p_Var4 != p_Var5) {
    do {
      QPDFObjectHandle::newDictionary();
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)local_208,(string *)(p_Var4 + 1),
                 (QPDFObjectHandle *)(local_168 + 0x10));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != p_Var5);
  }
  local_188.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_208._0_8_;
  local_188.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_;
  if ((QPDFObjGen)local_208._8_8_ != (QPDFObjGen)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_208._8_8_ + 8) = *(_Atomic_word *)(local_208._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_208._8_8_ + 8) = *(_Atomic_word *)(local_208._8_8_ + 8) + 1;
    }
  }
  QPDFObjectHandle::mergeResources
            ((QPDFObjectHandle *)&local_228,&local_188,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              *)0x0);
  if ((QPDFObjGen)
      local_188.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (QPDFObjGen)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  p_Var4 = *(_Base_ptr *)(local_228.field_2._8_8_ + 0x18);
  local_c0 = p_Var5;
  if (p_Var4 != p_Var5) {
    key = (string *)(local_168 + 0x10);
    do {
      local_b8 = p_Var4 + 1;
      QPDFObjectHandle::getKey((QPDFObjectHandle *)key,&local_228);
      local_1e0._32_8_ = p_Var4;
      bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)key);
      if (bVar3) {
        p_Var5 = *(_Base_ptr *)(local_1e0._32_8_ + 0x58);
        local_b0 = (_Base_ptr)(local_1e0._32_8_ + 0x48);
        if (p_Var5 != local_b0) {
          do {
            QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_a8,key);
            bVar3 = QPDFObjectHandle::isNull((QPDFObjectHandle *)&local_a8);
            if (!bVar3) {
              QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1f0,(string *)local_208);
              QPDFObjectHandle::replaceKey
                        ((QPDFObjectHandle *)local_1f0,(string *)(p_Var5 + 2),
                         (QPDFObjectHandle *)&local_a8);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_);
              }
            }
            QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1f0,key);
            bVar3 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_1f0);
            if (!bVar3) {
              QPDFObjectHandle::replaceKey
                        ((QPDFObjectHandle *)key,(string *)(p_Var5 + 2),
                         (QPDFObjectHandle *)local_1f0);
              QPDFObjectHandle::removeKey((QPDFObjectHandle *)key,(string *)(p_Var5 + 1));
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_);
            }
            if (local_a8.m.
                super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_a8.m.
                         super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
            }
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
          } while (p_Var5 != local_b0);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)local_1e0._32_8_);
    } while (p_Var4 != local_c0);
  }
  local_198.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_208._0_8_;
  local_198.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_;
  if ((QPDFObjGen)local_208._8_8_ != (QPDFObjGen)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_208._8_8_ + 8) = *(_Atomic_word *)(local_208._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_208._8_8_ + 8) = *(_Atomic_word *)(local_208._8_8_ + 8) + 1;
    }
  }
  QPDFObjectHandle::mergeResources
            ((QPDFObjectHandle *)&local_228,&local_198,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              *)local_228.field_2._8_8_);
  if ((QPDFObjGen)
      local_198.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (QPDFObjGen)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  QPDFObjectHandle::ditems((QPDFObjectHandle *)&local_228);
  QPDFObjectHandle::QPDFDictItems::begin((iterator *)(local_168 + 0x10),&local_1a8);
  QPDFObjectHandle::QPDFDictItems::end(&local_a8,&local_1a8);
  this_00 = (iterator *)(local_168 + 0x10);
  while (bVar3 = QPDFObjectHandle::QPDFDictItems::iterator::operator==(this_00,&local_a8), !bVar3) {
    pTVar6 = QPDFObjectHandle::QPDFDictItems::iterator::operator*[abi_cxx11_(this_00);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
    ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
            *)local_1f0,pTVar6);
    bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_1e0 + 0x10));
    if (bVar3) {
      QPDFObjectHandle::getKeys_abi_cxx11_
                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_60,(QPDFObjectHandle *)(local_1e0 + 0x10));
      bVar3 = local_60._M_impl.super__Rb_tree_header._M_node_count == 0;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_60);
    }
    else {
      bVar3 = false;
    }
    if (bVar3) {
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)&local_228,(string *)local_1f0);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._24_8_);
    }
    if ((element_type *)local_1f0._0_8_ != (element_type *)local_1e0) {
      operator_delete((void *)local_1f0._0_8_,local_1e0._0_8_ + 1);
    }
    QPDFObjectHandle::QPDFDictItems::iterator::operator++(this_00);
  }
  QPDFObjectHandle::QPDFDictItems::iterator::~iterator(&local_a8);
  QPDFObjectHandle::QPDFDictItems::iterator::~iterator((iterator *)(local_168 + 0x10));
  if (local_1a8.oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8.oh.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  ResourceFinder::ResourceFinder((ResourceFinder *)(local_168 + 0x10));
  QPDF::numWarnings(*(QPDF **)(local_208._16_8_ + 8));
  QPDFObjectHandle::parseAsContents
            ((QPDFObjectHandle *)local_228.field_2._M_allocated_capacity,
             (ParserCallbacks *)(local_168 + 0x10));
  QPDF::numWarnings(*(QPDF **)(local_208._16_8_ + 8));
  this_01 = (ResourceReplacer *)operator_new(0x48);
  rnames = ResourceFinder::getNamesByResourceType_abi_cxx11_((ResourceFinder *)(local_168 + 0x10));
  anon_unknown.dwarf_2770e6::ResourceReplacer::ResourceReplacer
            (this_01,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      *)local_228.field_2._8_8_,rnames);
  this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this_02->_M_use_count = 1;
  this_02->_M_weak_count = 1;
  this_02->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_002f3138;
  this_02[1]._vptr__Sp_counted_base = (_func_int **)this_01;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_02->_M_use_count = this_02->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_02->_M_use_count = 2;
  }
  local_1b8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_01;
  local_1b8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = this_02;
  QPDFObjectHandle::addTokenFilter
            ((QPDFObjectHandle *)local_228.field_2._M_allocated_capacity,&local_1b8);
  if (local_1b8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b8.
               super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  ResourceFinder::~ResourceFinder((ResourceFinder *)(local_168 + 0x10));
  if ((QPDFObjGen)local_208._8_8_ != (QPDFObjGen)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._M_string_length);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
  }
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::adjustAppearanceStream(
    QPDFObjectHandle stream, std::map<std::string, std::map<std::string, std::string>> dr_map)
{
    // We don't have to modify appearance streams or their resource dictionaries for them to display
    // properly, but we need to do so to make them save to regenerate. Suppose an appearance stream
    // as a font /F1 that is different from /F1 in /DR, and that when we copy the field, /F1 is
    // remapped to /F1_1. When the field is regenerated, /F1_1 won't appear in the stream's resource
    // dictionary, so the regenerated appearance stream will revert to the /F1_1 in /DR. If we
    // adjust existing appearance streams, we are protected from this problem.

    auto dict = stream.getDict();
    auto resources = dict.getKey("/Resources");

    // Make sure this stream has its own private resource dictionary.
    bool was_indirect = resources.isIndirect();
    resources = resources.shallowCopy();
    if (was_indirect) {
        resources = qpdf.makeIndirectObject(resources);
    }
    dict.replaceKey("/Resources", resources);
    // Create a dictionary with top-level keys so we can use mergeResources to force them to be
    // unshared. We will also use this to resolve conflicts that may already be in the resource
    // dictionary.
    auto merge_with = QPDFObjectHandle::newDictionary();
    for (auto const& top_key: dr_map) {
        merge_with.replaceKey(top_key.first, QPDFObjectHandle::newDictionary());
    }
    resources.mergeResources(merge_with);
    // Rename any keys in the resource dictionary that we remapped.
    for (auto const& i1: dr_map) {
        std::string const& top_key = i1.first;
        auto subdict = resources.getKey(top_key);
        if (!subdict.isDictionary()) {
            continue;
        }
        for (auto const& i2: i1.second) {
            std::string const& old_key = i2.first;
            std::string const& new_key = i2.second;
            auto existing_new = subdict.getKey(new_key);
            if (!existing_new.isNull()) {
                // The resource dictionary already has a key in it matching what we remapped an old
                // key to, so we'll have to move it out of the way. Stick it in merge_with, which we
                // will re-merge with the dictionary when we're done. We know merge_with already has
                // dictionaries for all the top keys.
                QTC::TC("qpdf", "QPDFAcroFormDocumentHelper ap conflict");
                merge_with.getKey(top_key).replaceKey(new_key, existing_new);
            }
            auto existing_old = subdict.getKey(old_key);
            if (!existing_old.isNull()) {
                QTC::TC("qpdf", "QPDFAcroFormDocumentHelper ap rename");
                subdict.replaceKey(new_key, existing_old);
                subdict.removeKey(old_key);
            }
        }
    }
    // Deal with any any conflicts by re-merging with merge_with and updating our local copy of
    // dr_map, which we will use to modify the stream contents.
    resources.mergeResources(merge_with, &dr_map);
    // Remove empty subdictionaries
    for (auto iter: resources.ditems()) {
        if (iter.second.isDictionary() && (iter.second.getKeys().size() == 0)) {
            resources.removeKey(iter.first);
        }
    }

    // Now attach a token filter to replace the actual resources.
    ResourceFinder rf;
    try {
        auto nwarnings = qpdf.numWarnings();
        stream.parseAsContents(&rf);
        if (qpdf.numWarnings() > nwarnings) {
            QTC::TC("qpdf", "QPDFAcroFormDocumentHelper AP parse error");
        }
        auto rr = new ResourceReplacer(dr_map, rf.getNamesByResourceType());
        auto tf = std::shared_ptr<QPDFObjectHandle::TokenFilter>(rr);
        stream.addTokenFilter(tf);
    } catch (std::exception& e) {
        // No way to reproduce in test suite right now since error conditions are converted to
        // warnings.
        stream.warnIfPossible(std::string("Unable to parse appearance stream: ") + e.what());
    }
}